

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v5::internal::fp::normalize<1>(fp *this)

{
  ulong uVar1;
  
  uVar1 = this->f;
  while ((uVar1 >> 0x35 & 1) == 0) {
    uVar1 = uVar1 * 2;
    this->f = uVar1;
    this->e = this->e + -1;
  }
  this->f = uVar1 << 10;
  this->e = this->e + -10;
  return;
}

Assistant:

void normalize() {
    // Handle subnormals.
    auto shifted_implicit_bit = implicit_bit << SHIFT;
    while ((f & shifted_implicit_bit) == 0) {
      f <<= 1;
      --e;
    }
    // Subtract 1 to account for hidden bit.
    auto offset = significand_size - double_significand_size - SHIFT - 1;
    f <<= offset;
    e -= offset;
  }